

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall dg::vr::GraphBuilder::buildBlocks(GraphBuilder *this,Function *function)

{
  VRCodeGraph *this_00;
  VRLocation *loc;
  long lVar1;
  Function *__range2;
  Function *block;
  Instruction *ptr;
  Function *pFVar2;
  
  for (pFVar2 = function + 0x50; pFVar2 = *(Function **)pFVar2, pFVar2 != function + 0x48;
      pFVar2 = pFVar2 + 8) {
    block = pFVar2 + -0x18;
    if (pFVar2 == (Function *)0x0) {
      block = (Function *)0x0;
    }
    buildBlock(this,(BasicBlock *)block);
  }
  this_00 = *(VRCodeGraph **)(this + 8);
  lVar1 = *(long *)(function + 0x50) + -0x18;
  if (*(long *)(function + 0x50) == 0) {
    lVar1 = 0;
  }
  ptr = (Instruction *)(*(long *)(lVar1 + 0x30) + -0x18);
  if (*(long *)(lVar1 + 0x30) == 0) {
    ptr = (Instruction *)0x0;
  }
  loc = VRCodeGraph::getVRLocation(this_00,ptr);
  VRCodeGraph::setEntryLocation(this_00,function,loc);
  return;
}

Assistant:

void GraphBuilder::buildBlocks(const llvm::Function &function) {
    for (const llvm::BasicBlock &block : function) {
        assert(!block.empty());
        buildBlock(block);
    }

    codeGraph.setEntryLocation(
            &function,
            codeGraph.getVRLocation(&function.getEntryBlock().front()));
}